

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

int row_mt_worker_hook(void *arg1,void *arg2)

{
  AV1_COMMON *cm_00;
  TileInfo *tile;
  long lVar1;
  int *piVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ThreadData *td;
  int *piVar8;
  TileDataDec *tile_data;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  DecoderCodingBlock *pDVar12;
  DecoderCodingBlock *pDVar13;
  MACROBLOCKD *pMVar14;
  ENTROPY_CONTEXT (*paEVar15) [32];
  byte bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  TileJobsDec *pTVar25;
  int iVar26;
  int row;
  long lVar27;
  int iVar28;
  size_t __n;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  void *__src;
  long lVar34;
  pthread_mutex_t *ppVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long *plVar40;
  long lVar41;
  qm_val_t *(*__dest) [19];
  bool bVar42;
  AV1_COMMON *cm;
  
  td = *arg1;
  (td->dcb).corrupted = 0;
  iVar17 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xe8));
  if (iVar17 == 0) {
    *(undefined4 *)((long)arg1 + 0xe0) = 1;
    if (*(int *)((long)arg2 + 0x9e44) == 0) {
      bVar16 = *(byte *)((long)arg2 + 0x3d4c) ^ 1;
    }
    else {
      bVar16 = 0;
    }
    td->predict_and_recon_intra_block_visit = decode_block_void;
    td->inverse_tx_inter_block_visit = decode_block_void;
    td->predict_inter_block_visit = predict_inter_block_void;
    td->cfl_store_inter_block_visit = cfl_store_inter_block_void;
    td->read_coeffs_tx_intra_block_visit = read_coeffs_tx_intra_block;
    td->read_coeffs_tx_inter_block_visit = av1_read_coeffs_txb;
    if ((td->dcb).corrupted == 0) {
      piVar8 = &(td->dcb).corrupted;
      cm_00 = (AV1_COMMON *)((long)arg2 + 0x3b60);
      pDVar12 = &td->dcb;
      do {
        pTVar25 = get_dec_job_info((AV1DecTileMT *)((long)arg2 + 0x58d30));
        if (pTVar25 == (TileJobsDec *)0x0) {
          if (*piVar8 == 0) {
            td->read_coeffs_tx_intra_block_visit = decode_block_void;
            td->read_coeffs_tx_inter_block_visit = decode_block_void;
            td->predict_and_recon_intra_block_visit = predict_and_reconstruct_intra_block;
            td->inverse_tx_inter_block_visit = inverse_transform_inter_block;
            td->predict_inter_block_visit = predict_inter_block;
            td->cfl_store_inter_block_visit = cfl_store_inter_block;
            pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            iVar17 = *(int *)((long)arg2 + 0x5f710);
            if (iVar17 == *(int *)((long)arg2 + 0x5f708)) goto LAB_001701c6;
            goto LAB_0016f9d1;
          }
          break;
        }
        tile_data = pTVar25->tile_data;
        tile_worker_hook_init
                  ((AV1Decoder *)arg2,(DecWorkerData *)arg1,pTVar25->tile_buffer,tile_data,bVar16);
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        piVar2 = &(tile_data->dec_row_mt_sync).num_threads_working;
        *piVar2 = *piVar2 + 1;
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        lVar30 = *(long *)((long)arg2 + 0x9be8);
        bVar3 = *(byte *)(lVar30 + 0x1c);
        cVar4 = *(char *)(lVar30 + 0x4d);
        lVar41 = (long)(tile_data->tile_info).tile_row;
        iVar17 = (tile_data->tile_info).mi_col_start;
        lVar39 = (long)iVar17;
        uVar33 = -1L << (*(byte *)(lVar30 + 0x24) & 0x3f);
        bVar5 = *(byte *)(lVar30 + 0x60);
        uVar33 = (long)(int)(~(uint)uVar33 + ((tile_data->tile_info).mi_col_end - iVar17)) & uVar33;
        memset((void *)(*(long *)(*(long *)((long)arg2 + 0x9e60) + lVar41 * 8) + lVar39),0,uVar33);
        bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar3];
        bVar42 = cVar4 == '\0';
        if (bVar42) {
          lVar30 = *(long *)(*(long *)((long)arg2 + 0x9e68) + lVar41 * 8);
          if ((lVar30 == 0) || (*(long *)(*(long *)((long)arg2 + 0x9e70) + lVar41 * 8) == 0)) {
            aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                               "Invalid value of planes");
          }
          else {
            lVar31 = (long)(iVar17 >> (bVar5 & 0x1f));
            __n = (size_t)((int)uVar33 >> (bVar5 & 0x1f));
            memset((void *)(lVar30 + lVar31),0,__n);
            memset((void *)(lVar31 + *(long *)(*(long *)((long)arg2 + 0x9e70) + lVar41 * 8)),0,__n);
          }
        }
        uVar19 = (uint)bVar42 * 2 + 1;
        memset((void *)(*(long *)(*(long *)((long)arg2 + 0x9e58) + lVar41 * 8) + lVar39),0,uVar33);
        memset((void *)(lVar39 + *(long *)(*(long *)((long)arg2 + 0x9e78) + lVar41 * 8)),0x40,uVar33
              );
        av1_reset_loop_filter_delta((MACROBLOCKD *)td,uVar19);
        av1_reset_loop_restoration((MACROBLOCKD *)td,uVar19);
        iVar17 = (tile_data->tile_info).mi_row_start;
        if (iVar17 < (tile_data->tile_info).mi_row_end) {
          do {
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x11) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x12) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x13) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x14) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x15) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x16) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x17) = '\0';
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x18) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x19) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1a) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1b) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1c) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1d) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1e) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0x1f) = '\0';
            pMVar14 = &(td->dcb).xd;
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 0) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 1) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 2) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 3) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 4) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 5) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 6) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 2) + 7) = '\0';
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 8) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 9) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0xb) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0xc) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0xd) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0xe) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 2) + 0xf) = '\0';
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x11) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x12) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x13) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x14) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x15) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x16) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x17) = '\0';
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x18) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x19) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1a) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1b) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1c) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1d) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1e) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0x1f) = '\0';
            pMVar14 = &(td->dcb).xd;
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 0) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 1) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 2) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 3) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 4) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 5) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 6) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 1) + 7) = '\0';
            paEVar15 = (td->dcb).xd.left_entropy_context;
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 8) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 9) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0xb) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0xc) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0xd) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0xe) = '\0';
            *(ENTROPY_CONTEXT *)((long)(paEVar15 + 1) + 0xf) = '\0';
            pMVar14 = &(td->dcb).xd;
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x11) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x12) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x13) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x14) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x15) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x16) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x17) = '\0';
            pMVar14 = &(td->dcb).xd;
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x18) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x19) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1a) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1b) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1c) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1d) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1e) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0x1f) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 0) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 1) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 2) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 3) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 4) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 5) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 6) = '\0';
            *(ENTROPY_CONTEXT *)((long)((pDVar12->xd).left_entropy_context + 0) + 7) = '\0';
            pMVar14 = &(td->dcb).xd;
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 8) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 9) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 10) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0xb) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0xc) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0xd) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0xe) = '\0';
            *(ENTROPY_CONTEXT *)((long)(pMVar14->left_entropy_context + 0) + 0xf) = '\0';
            pDVar13 = &td->dcb;
            (pDVar13->xd).left_partition_context[0x10] = '\0';
            (pDVar13->xd).left_partition_context[0x11] = '\0';
            (pDVar13->xd).left_partition_context[0x12] = '\0';
            (pDVar13->xd).left_partition_context[0x13] = '\0';
            (pDVar13->xd).left_partition_context[0x14] = '\0';
            (pDVar13->xd).left_partition_context[0x15] = '\0';
            (pDVar13->xd).left_partition_context[0x16] = '\0';
            (pDVar13->xd).left_partition_context[0x17] = '\0';
            pDVar13 = &td->dcb;
            (pDVar13->xd).left_partition_context[0x18] = '\0';
            (pDVar13->xd).left_partition_context[0x19] = '\0';
            (pDVar13->xd).left_partition_context[0x1a] = '\0';
            (pDVar13->xd).left_partition_context[0x1b] = '\0';
            (pDVar13->xd).left_partition_context[0x1c] = '\0';
            (pDVar13->xd).left_partition_context[0x1d] = '\0';
            (pDVar13->xd).left_partition_context[0x1e] = '\0';
            (pDVar13->xd).left_partition_context[0x1f] = '\0';
            (td->dcb).xd.left_partition_context[0] = '\0';
            (td->dcb).xd.left_partition_context[1] = '\0';
            (td->dcb).xd.left_partition_context[2] = '\0';
            (td->dcb).xd.left_partition_context[3] = '\0';
            (td->dcb).xd.left_partition_context[4] = '\0';
            (td->dcb).xd.left_partition_context[5] = '\0';
            (td->dcb).xd.left_partition_context[6] = '\0';
            (td->dcb).xd.left_partition_context[7] = '\0';
            pDVar13 = &td->dcb;
            (pDVar13->xd).left_partition_context[8] = '\0';
            (pDVar13->xd).left_partition_context[9] = '\0';
            (pDVar13->xd).left_partition_context[10] = '\0';
            (pDVar13->xd).left_partition_context[0xb] = '\0';
            (pDVar13->xd).left_partition_context[0xc] = '\0';
            (pDVar13->xd).left_partition_context[0xd] = '\0';
            (pDVar13->xd).left_partition_context[0xe] = '\0';
            (pDVar13->xd).left_partition_context[0xf] = '\0';
            builtin_memcpy((td->dcb).xd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",
                           0x20);
            iVar26 = (tile_data->tile_info).mi_col_start;
            if (iVar26 < (tile_data->tile_info).mi_col_end) {
              lVar30 = *(long *)((long)arg2 + 0x9be8);
              do {
                bVar5 = *(byte *)(lVar30 + 0x24);
                lVar39 = (long)((iVar26 >> (bVar5 & 0x1f)) +
                               (iVar17 >> (bVar5 & 0x1f)) *
                               ((*(int *)((long)arg2 + 0x3d78) >> (bVar5 & 0x1f)) + 1)) * 0x3b000;
                lVar30 = *(long *)((long)arg2 + 0x5f6d0) + lVar39;
                lVar41 = *(long *)((long)arg2 + 0x5f6d0) + lVar39 + 0x30000;
                lVar31 = 0x1d90;
                lVar39 = lVar30;
                do {
                  *(long *)((long)td + lVar31 * 8 + -0xb198) = lVar39;
                  *(long *)((long)td + lVar31 * 8 + -0xb178) = lVar41;
                  *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -3) + lVar31 * 2) = 0;
                  *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar31 * 2) = 0;
                  lVar27 = lVar31 - (ulong)uVar19;
                  lVar31 = lVar31 + 1;
                  lVar41 = lVar41 + 0x1000;
                  lVar39 = lVar39 + 0x10000;
                } while (lVar27 != 0x1d8f);
                (td->dcb).xd.plane[0].color_index_map = (uint8_t *)(lVar30 + 0x33000);
                (td->dcb).xd.plane[1].color_index_map = (uint8_t *)(lVar30 + 0x37000);
                (td->dcb).xd.color_index_map_offset[0] = 0;
                (td->dcb).xd.color_index_map_offset[1] = 0;
                decode_partition((AV1Decoder *)arg2,td,iVar17,iVar26,td->bit_reader,
                                 *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),1);
                iVar20 = aom_reader_has_overflowed(td->bit_reader);
                if (iVar20 != 0) {
                  uVar19 = 1;
                  goto LAB_0016f847;
                }
                lVar30 = *(long *)((long)arg2 + 0x9be8);
                iVar26 = iVar26 + *(int *)(lVar30 + 0x20);
              } while (iVar26 < (tile_data->tile_info).mi_col_end);
            }
            pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            piVar2 = &(tile_data->dec_row_mt_sync).mi_rows_parse_done;
            *piVar2 = *piVar2 + (uint)bVar3;
            *(int *)((long)arg2 + 0x5f70c) = *(int *)((long)arg2 + 0x5f70c) + (uint)bVar3;
            pthread_cond_signal(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
            pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
            iVar17 = iVar17 + *(int *)(*(long *)((long)arg2 + 0x9be8) + 0x20);
          } while (iVar17 < (tile_data->tile_info).mi_row_end);
        }
        iVar17 = check_trailing_bits_after_symbol_coder(td->bit_reader);
        uVar19 = (uint)(iVar17 != 0);
LAB_0016f847:
        aom_merge_corrupted_flag(piVar8,uVar19);
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
        piVar2 = &(tile_data->dec_row_mt_sync).num_threads_working;
        *piVar2 = *piVar2 + -1;
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      } while (*piVar8 == 0);
    }
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    ppVar35 = *(pthread_mutex_t **)((long)arg2 + 0x5f6e0);
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    *(undefined4 *)(*arg1 + 0x3ad0) = 1;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg2 + 0x5f714) = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    piVar8 = *arg1;
    iVar17 = *piVar8;
    iVar26 = piVar8[0x7a8];
    bVar16 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x24);
    iVar18 = av1_get_sb_cols_in_tile
                       ((AV1_COMMON *)((long)arg2 + 0x3b60),(TileInfo *)(piVar8 + 0x7a8));
    lVar41 = (long)*(int *)((long)arg2 + 0x9c00) * (long)piVar8[0x7ac] * 0x53a0 +
             *(long *)((long)arg2 + 0x48d20);
    lVar30 = (long)piVar8[0x7ad] * 0x53a0;
    iVar20 = *(int *)(lVar30 + 0x5380 + lVar41);
    iVar6 = *(int *)(lVar30 + 0x5384 + lVar41);
    lVar39 = (long)(iVar17 - iVar26 >> (bVar16 & 0x1f));
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)(lVar30 + 0x5360 + lVar41) + lVar39 * 0x28));
    *(int *)(*(long *)(lVar30 + 0x5378 + lVar41) + lVar39 * 4) = iVar18 + iVar20 + iVar6;
    pthread_cond_signal((pthread_cond_t *)(lVar39 * 0x30 + *(long *)(lVar30 + 0x5368 + lVar41)));
    ppVar35 = (pthread_mutex_t *)(lVar39 * 0x28 + *(long *)(lVar30 + 0x5360 + lVar41));
  }
  pthread_mutex_unlock(ppVar35);
  return 0;
LAB_0016f9d1:
  if (*(int *)((long)arg2 + 0x5f714) == 1) goto LAB_001701c6;
  iVar26 = *(int *)((long)arg2 + 0x5f6f0);
  iVar20 = *(int *)((long)arg2 + 0x5f6f4);
  if (iVar26 < iVar20 && *(int *)((long)arg2 + 0x5f70c) != iVar17) {
    iVar17 = *(int *)((long)arg2 + 0x5f6f8);
    iVar6 = *(int *)((long)arg2 + 0x5f6fc);
    iVar18 = *(int *)((long)arg2 + 0x5f700);
    iVar23 = *(int *)((long)arg2 + 0x5f704);
    bVar16 = *(byte *)(*(long *)((long)arg2 + 0x9be8) + 0x1c);
    iVar37 = 0;
    iVar36 = -1;
    row = -1;
    iVar21 = 0x7fffffff;
    do {
      lVar30 = (long)iVar17 * 0x53a0;
      iVar38 = iVar17;
      iVar22 = iVar21;
      if (iVar17 < iVar6) {
        do {
          iVar28 = *(int *)((long)arg2 + 0x9c00) * iVar26;
          iVar32 = iVar28 + iVar38;
          iVar21 = iVar22;
          if ((iVar18 <= iVar32) && (iVar32 <= iVar23)) {
            lVar39 = (long)iVar28 * 0x53a0 + *(long *)((long)arg2 + 0x48d20);
            iVar28 = *(int *)(lVar30 + 0x5394 + lVar39);
            iVar32 = *(int *)(lVar30 + 0x538c + lVar39);
            if (0 < (*(int *)(lVar30 + 0x5390 + lVar39) - iVar28) * iVar32) {
              iVar7 = *(int *)(lVar30 + 0x5398 + lVar39);
              if (iVar7 < iVar22) {
                iVar37 = 0;
                iVar21 = iVar7;
              }
              if (((iVar7 <= iVar22) &&
                  (iVar32 = (*(int *)(lVar30 + 0x5388 + lVar39) - iVar28) * iVar32, iVar37 < iVar32)
                  ) && (iVar22 = av1_get_sb_rows_in_tile(cm_00,(TileInfo *)(lVar39 + lVar30)),
                       iVar7 < (int)((iVar22 != 1) + 1))) {
                iVar37 = iVar32;
                row = iVar26;
                iVar36 = iVar38;
              }
            }
          }
          iVar38 = iVar38 + 1;
          lVar30 = lVar30 + 0x53a0;
          iVar22 = iVar21;
        } while (iVar6 != iVar38);
      }
      iVar26 = iVar26 + 1;
    } while (iVar26 != iVar20);
    if ((row != -1) && (iVar36 != -1)) {
      lVar30 = (long)*(int *)((long)arg2 + 0x9c00) * (long)row * 0x53a0 +
               *(long *)((long)arg2 + 0x48d20);
      bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar16];
      lVar39 = (long)iVar36 * 0x53a0;
      iVar17 = *(int *)(lVar39 + 0x5394 + lVar30);
      piVar2 = (int *)(lVar39 + 0x5398 + lVar30);
      *piVar2 = *piVar2 + 1;
      *(uint *)(lVar39 + 0x5394 + lVar30) = iVar17 + (uint)bVar16;
      iVar26 = (uint)bVar16 + *(int *)((long)arg2 + 0x5f710);
      iVar17 = *(int *)(lVar39 + lVar30) + iVar17;
      *(int *)((long)arg2 + 0x5f710) = iVar26;
      if (iVar26 == *(int *)((long)arg2 + 0x5f708)) {
        pthread_cond_broadcast(*(pthread_cond_t **)((long)arg2 + 0x5f6e8));
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      lVar30 = *(long *)((long)arg2 + 0x48d20);
      iVar26 = *(int *)((long)arg2 + 0x9c00);
      av1_tile_init(&(td->dcb).xd.tile,cm_00,row,iVar36);
      cVar4 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d);
      uVar33 = 0;
      __dest = (td->dcb).xd.plane[0].seg_iqmatrix;
      do {
        if (*(char *)((long)(__dest + -2) + 0x80) == '\0') {
          uVar9 = *(undefined8 *)((long)arg2 + 0x3de4);
          uVar10 = *(undefined8 *)((long)arg2 + 0x3dec);
          uVar11 = *(undefined8 *)((long)arg2 + 0x3dfc);
          *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3df4);
          *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar11;
          *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar9;
          *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar10;
          __src = (void *)((long)arg2 + 0x7748);
        }
        else if (uVar33 == 1) {
          uVar9 = *(undefined8 *)((long)arg2 + 0x3e04);
          uVar10 = *(undefined8 *)((long)arg2 + 0x3e0c);
          uVar11 = *(undefined8 *)((long)arg2 + 0x3e1c);
          *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3e14);
          *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar11;
          *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar9;
          *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar10;
          __src = (void *)((long)arg2 + 0x7c08);
        }
        else {
          uVar9 = *(undefined8 *)((long)arg2 + 0x3e24);
          uVar10 = *(undefined8 *)((long)arg2 + 0x3e2c);
          uVar11 = *(undefined8 *)((long)arg2 + 0x3e3c);
          *(undefined8 *)((long)(__dest + -1) + 0x78) = *(undefined8 *)((long)arg2 + 0x3e34);
          *(undefined8 *)((long)(__dest + -1) + 0x80) = uVar11;
          *(undefined8 *)((long)(__dest + -1) + 0x68) = uVar9;
          *(undefined8 *)((long)(__dest + -1) + 0x70) = uVar10;
          __src = (void *)((long)arg2 + 0x80c8);
        }
        memcpy(__dest,__src,0x4c0);
        if (cVar4 != '\0') break;
        __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
        bVar42 = uVar33 < 2;
        uVar33 = uVar33 + 1;
      } while (bVar42);
      lVar30 = lVar30 + (long)iVar26 * (long)row * 0x53a0;
      tile = (TileInfo *)(lVar39 + lVar30);
      (td->dcb).xd.mi_stride = *(int *)((long)arg2 + 0x3da4);
      (td->dcb).xd.error_info = *(aom_internal_error_info **)((long)arg2 + 0x3b90);
      cfl_init(&(td->dcb).xd.cfl,*(SequenceHeader **)((long)arg2 + 0x9be8));
      (td->dcb).xd.error_info = (aom_internal_error_info *)((long)arg1 + 0x10);
      cVar4 = *(char *)(*(long *)((long)arg2 + 0x9be8) + 0x4d);
      lVar41 = *(long *)((long)arg2 + 0x48d20);
      iVar26 = *(int *)(lVar39 + 0x10 + lVar30);
      iVar20 = *(int *)((long)arg2 + 0x9c00);
      iVar6 = *(int *)(lVar39 + 0x14 + lVar30);
      iVar23 = av1_get_sb_cols_in_tile(cm_00,tile);
      iVar18 = *(int *)(lVar39 + 8 + lVar30);
      if (iVar18 < *(int *)(lVar39 + 0xc + lVar30)) {
        lVar39 = *(long *)((long)arg2 + 0x9be8);
        iVar36 = iVar17 - tile->mi_row_start >> (*(byte *)(lVar39 + 0x24) & 0x1f);
        uVar19 = 0;
        lVar30 = (long)iVar6 * 0x53a0 + lVar41 + (long)iVar20 * (long)iVar26 * 0x53a0;
        plVar40 = (long *)(lVar30 + 0x5360);
        lVar41 = (long)(iVar36 + -1);
        lVar31 = (long)iVar36;
        do {
          bVar16 = *(byte *)(lVar39 + 0x24);
          lVar27 = (long)((iVar18 >> (bVar16 & 0x1f)) +
                         (iVar17 >> (bVar16 & 0x1f)) *
                         ((*(int *)((long)arg2 + 0x3d78) >> (bVar16 & 0x1f)) + 1)) * 0x3b000;
          lVar39 = *(long *)((long)arg2 + 0x5f6d0) + lVar27;
          lVar29 = *(long *)((long)arg2 + 0x5f6d0) + lVar27 + 0x30000;
          lVar34 = 0x1d90;
          lVar27 = lVar39;
          do {
            *(long *)((long)td + lVar34 * 8 + -0xb198) = lVar27;
            *(long *)((long)td + lVar34 * 8 + -0xb178) = lVar29;
            *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -3) + lVar34 * 2) = 0;
            *(undefined2 *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar34 * 2) = 0;
            lVar1 = lVar34 + (-(ulong)(cVar4 != '\0') | 0xfffffffffffffffd);
            lVar34 = lVar34 + 1;
            lVar29 = lVar29 + 0x1000;
            lVar27 = lVar27 + 0x10000;
          } while (lVar1 != 0x1d8f);
          (td->dcb).xd.plane[0].color_index_map = (uint8_t *)(lVar39 + 0x33000);
          (td->dcb).xd.plane[1].color_index_map = (uint8_t *)(lVar39 + 0x37000);
          (td->dcb).xd.color_index_map_offset[0] = 0;
          (td->dcb).xd.color_index_map_offset[1] = 0;
          if ((iVar36 != 0) &&
             (iVar26 = *(int *)(lVar30 + 0x5380), (iVar26 + 0x7fffffffU & uVar19) == 0)) {
            ppVar35 = (pthread_mutex_t *)(lVar41 * 0x28 + *plVar40);
            pthread_mutex_lock(ppVar35);
            iVar20 = *(int *)(*(long *)(lVar30 + 0x5378) + lVar41 * 4) -
                     (*(int *)(lVar30 + 0x5384) + iVar26);
            while (iVar20 < (int)uVar19) {
              pthread_cond_wait((pthread_cond_t *)(lVar41 * 0x30 + *(long *)(lVar30 + 0x5368)),
                                ppVar35);
              iVar20 = *(int *)(*(long *)(lVar30 + 0x5378) + lVar41 * 4) -
                       (*(int *)(lVar30 + 0x5384) + iVar26);
            }
            pthread_mutex_unlock(ppVar35);
          }
          pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
          iVar26 = *(int *)((long)arg2 + 0x5f714);
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
          if (iVar26 == 0) {
            decode_partition((AV1Decoder *)arg2,td,iVar17,iVar18,td->bit_reader,
                             *(BLOCK_SIZE *)(*(long *)((long)arg2 + 0x9be8) + 0x1c),2);
          }
          if ((int)uVar19 < iVar23 + -1) {
            uVar24 = uVar19;
            if ((int)uVar19 % *(int *)(lVar30 + 0x5380) == 0) goto LAB_001700d2;
          }
          else {
            uVar24 = *(int *)(lVar30 + 0x5380) + iVar23 + *(int *)(lVar30 + 0x5384);
LAB_001700d2:
            pthread_mutex_lock((pthread_mutex_t *)(*plVar40 + lVar31 * 0x28));
            *(uint *)(*(long *)(lVar30 + 0x5378) + lVar31 * 4) = uVar24;
            pthread_cond_signal((pthread_cond_t *)(lVar31 * 0x30 + *(long *)(lVar30 + 0x5368)));
            pthread_mutex_unlock((pthread_mutex_t *)(lVar31 * 0x28 + *plVar40));
          }
          lVar39 = *(long *)((long)arg2 + 0x9be8);
          iVar18 = iVar18 + *(int *)(lVar39 + 0x20);
          uVar19 = uVar19 + 1;
        } while (iVar18 < tile->mi_col_end);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      tile[0x37b].tile_row = tile[0x37b].tile_row + -1;
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      pthread_mutex_lock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
      iVar17 = *(int *)((long)arg2 + 0x5f710);
      if (iVar17 == *(int *)((long)arg2 + 0x5f708)) goto LAB_001701c6;
      goto LAB_0016f9d1;
    }
  }
  pthread_cond_wait(*(pthread_cond_t **)((long)arg2 + 0x5f6e8),
                    *(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
  iVar17 = *(int *)((long)arg2 + 0x5f710);
  if (iVar17 == *(int *)((long)arg2 + 0x5f708)) {
LAB_001701c6:
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg2 + 0x5f6e0));
    *(undefined4 *)((long)arg1 + 0xe0) = 0;
    return (uint)(*piVar8 == 0);
  }
  goto LAB_0016f9d1;
}

Assistant:

static int row_mt_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;
  td->dcb.corrupted = 0;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    // If any SB row (erroneous row) processed by a thread encounters an
    // internal error, there is a need to indicate other threads that decoding
    // of the erroneous row is complete. This ensures that other threads which
    // wait upon the completion of SB's present in erroneous row are not waiting
    // indefinitely.
    signal_decoding_done_for_erroneous_row(pbi, &thread_data->td->dcb.xd);
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  AV1_COMMON *cm = &pbi->common;
  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x1);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working++;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
      // decode tile
      parse_tile_row_mt(pbi, td, tile_data);
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
      tile_data->dec_row_mt_sync.num_threads_working--;
#if CONFIG_MULTITHREAD
      pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    } else {
      break;
    }
  }

  if (td->dcb.corrupted) {
    thread_data->error_info.setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    frame_row_mt_info->row_mt_exit = 1;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(pbi->row_mt_cond_);
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
    return 0;
  }

  set_decode_func_pointers(td, 0x2);

  while (1) {
    AV1DecRowMTJobInfo next_job_info;
    int end_of_frame = 0;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    while (!get_next_job_info(pbi, &next_job_info, &end_of_frame)) {
#if CONFIG_MULTITHREAD
      pthread_cond_wait(pbi->row_mt_cond_, pbi->row_mt_mutex_);
#endif
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif

    if (end_of_frame) break;

    int tile_row = next_job_info.tile_row;
    int tile_col = next_job_info.tile_col;
    int mi_row = next_job_info.mi_row;

    TileDataDec *tile_data =
        pbi->tile_data + tile_row * cm->tiles.cols + tile_col;
    AV1DecRowMTSync *dec_row_mt_sync = &tile_data->dec_row_mt_sync;

    av1_tile_init(&td->dcb.xd.tile, cm, tile_row, tile_col);
    av1_init_macroblockd(cm, &td->dcb.xd);
    td->dcb.xd.error_info = &thread_data->error_info;

    decode_tile_sb_row(pbi, td, &tile_data->tile_info, mi_row);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    dec_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}